

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O1

string * __thiscall
vkt::(anonymous_namespace)::getShaderName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ShaderType shaderType,
          size_t progNdx)

{
  char *__s;
  size_t sVar1;
  undefined4 in_register_00000014;
  ostringstream str;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  __s = glu::getShaderTypeName((ShaderType)this);
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  if (CONCAT44(in_register_00000014,shaderType) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"_",1);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string getShaderName (ShaderType shaderType, size_t progNdx)
{
	ostringstream str;
	str << glu::getShaderTypeName(shaderType);
	if (progNdx > 0)
		str << "_" << progNdx;
	return str.str();
}